

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::PLTerm>>,std::tuple<mp::PLTerm>>
               (tuple<testing::Matcher<mp::PLTerm>_> *matchers,tuple<mp::PLTerm> *values,ostream *os
               )

{
  PLTerm PVar1;
  MatcherInterface<mp::PLTerm> *pMVar2;
  linked_ptr_internal lVar3;
  int iVar4;
  ostream *poVar5;
  Value value;
  type matcher;
  StringMatchResultListener listener;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  _Head_base<0UL,_mp::PLTerm,_false> local_1e8;
  undefined **local_1e0;
  linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_> local_1d8;
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = &PTR__MatcherBase_001e19f0;
  local_1d8.value_ =
       (matchers->super__Tuple_impl<0UL,_testing::Matcher<mp::PLTerm>_>).
       super__Head_base<0UL,_testing::Matcher<mp::PLTerm>,_false>._M_head_impl.
       super_MatcherBase<mp::PLTerm>.impl_.value_;
  lVar3.next_ = &local_1d8.link_;
  if (local_1d8.value_ != (MatcherInterface<mp::PLTerm> *)0x0) {
    linked_ptr_internal::join
              (&local_1d8.link_,
               &(matchers->super__Tuple_impl<0UL,_testing::Matcher<mp::PLTerm>_>).
                super__Head_base<0UL,_testing::Matcher<mp::PLTerm>,_false>._M_head_impl.
                super_MatcherBase<mp::PLTerm>.impl_.link_);
    lVar3.next_ = local_1d8.link_.next_;
  }
  local_1d8.link_.next_ = lVar3.next_;
  local_1e0 = &PTR__MatcherBase_001e19a8;
  PVar1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>)
       (values->super__Tuple_impl<0UL,_mp::PLTerm>).super__Head_base<0UL,_mp::PLTerm,_false>.
       _M_head_impl.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_;
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_001e1300;
  local_1e8._M_head_impl.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
  impl_ = (PLTerm)(PLTerm)PVar1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar4 = (*((local_1d8.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4]
          )(local_1d8.value_,
            PVar1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_,
            &local_1c8);
  if ((char)iVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pMVar2 = (matchers->super__Tuple_impl<0UL,_testing::Matcher<mp::PLTerm>_>).
             super__Head_base<0UL,_testing::Matcher<mp::PLTerm>,_false>._M_head_impl.
             super_MatcherBase<mp::PLTerm>.impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    internal2::PrintBytesInObjectTo((uchar *)&local_1e8,8,os);
    std::__cxx11::stringbuf::str();
    iVar4 = std::__cxx11::string::compare((char *)&local_208);
    if ((os != (ostream *)0x0) && (iVar4 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_208,local_200);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_001e1300;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  local_1e0 = &PTR__MatcherBase_001e19f0;
  linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_>::~linked_ptr(&local_1d8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }